

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

Matrix3x3 *
CMU462::DynamicScene::rotateMatrix
          (Matrix3x3 *__return_storage_ptr__,float ux,float uy,float uz,float theta)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  fVar2 = cosf(theta);
  fVar3 = sinf(theta);
  fVar6 = 1.0 - fVar2;
  pdVar1 = Matrix3x3::operator()(__return_storage_ptr__,0,0);
  *pdVar1 = (double)(ux * ux * fVar6 + fVar2);
  fVar4 = ux * uy * fVar6;
  pdVar1 = Matrix3x3::operator()(__return_storage_ptr__,0,1);
  *pdVar1 = (double)(fVar4 - fVar3 * uz);
  fVar5 = ux * uz * fVar6;
  pdVar1 = Matrix3x3::operator()(__return_storage_ptr__,0,2);
  *pdVar1 = (double)(fVar5 + fVar3 * uy);
  pdVar1 = Matrix3x3::operator()(__return_storage_ptr__,1,0);
  *pdVar1 = (double)(fVar4 + fVar3 * uz);
  pdVar1 = Matrix3x3::operator()(__return_storage_ptr__,1,1);
  *pdVar1 = (double)(uy * uy * fVar6 + fVar2);
  fVar4 = uy * uz * fVar6;
  pdVar1 = Matrix3x3::operator()(__return_storage_ptr__,1,2);
  *pdVar1 = (double)(fVar4 - fVar3 * ux);
  pdVar1 = Matrix3x3::operator()(__return_storage_ptr__,2,0);
  *pdVar1 = (double)(fVar5 - fVar3 * uy);
  pdVar1 = Matrix3x3::operator()(__return_storage_ptr__,2,1);
  *pdVar1 = (double)(fVar4 + fVar3 * ux);
  pdVar1 = Matrix3x3::operator()(__return_storage_ptr__,2,2);
  *pdVar1 = (double)(uz * uz * fVar6 + fVar2);
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 rotateMatrix(float ux, float uy, float uz, float theta) {
  Matrix3x3 out = Matrix3x3();
  float c = cos(theta);
  float s = sin(theta);
  out(0, 0) = c + ux * ux * (1 - c);
  out(0, 1) = ux * uy * (1 - c) - uz * s;
  out(0, 2) = ux * uz * (1 - c) + uy * s;
  out(1, 0) = uy * ux * (1 - c) + uz * s;
  out(1, 1) = c + uy * uy * (1 - c);
  out(1, 2) = uy * uz * (1 - c) - ux * s;
  out(2, 0) = uz * ux * (1 - c) - uy * s;
  out(2, 1) = uz * uy * (1 - c) + ux * s;
  out(2, 2) = c + uz * uz * (1 - c);
  return out;
}